

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O0

void __thiscall BackgroundParser::JobProcessed(BackgroundParser *this,Job *job,bool succeeded)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  undefined4 *puVar4;
  CompileScriptException *pCVar5;
  CompileScriptException *pCVar6;
  CompileScriptException *oldPse;
  CompileScriptException *newPse;
  BackgroundParseItem *backgroundItem;
  bool succeeded_local;
  Job *job_local;
  BackgroundParser *this_local;
  
  RemoveFromUnprocessedItems(this,(BackgroundParseItem *)job);
  this->pendingBackgroundItems = this->pendingBackgroundItems - 1;
  if (!succeeded) {
    HVar3 = BackgroundParseItem::GetHR((BackgroundParseItem *)job);
    if ((-1 < HVar3) && (this->failedBackgroundParseItem == (BackgroundParseItem *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                         ,0x76,
                         "(((HRESULT)(backgroundItem->GetHR())<0) || failedBackgroundParseItem)",
                         "FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    HVar3 = BackgroundParseItem::GetHR((BackgroundParseItem *)job);
    if (HVar3 < 0) {
      if (this->failedBackgroundParseItem == (BackgroundParseItem *)0x0) {
        this->failedBackgroundParseItem = (BackgroundParseItem *)job;
      }
      else {
        pCVar5 = BackgroundParseItem::GetPSE((BackgroundParseItem *)job);
        pCVar6 = BackgroundParseItem::GetPSE(this->failedBackgroundParseItem);
        if ((pCVar5->line < pCVar6->line) ||
           ((pCVar5->line == pCVar6->line && (pCVar5->ichMinLine < pCVar6->ichMinLine)))) {
          this->failedBackgroundParseItem = (BackgroundParseItem *)job;
        }
      }
    }
  }
  return;
}

Assistant:

void BackgroundParser::JobProcessed(JsUtil::Job *const job, const bool succeeded)
{
    // This is called from inside a lock, so we can mess with background parser attributes.
    BackgroundParseItem *backgroundItem = static_cast<BackgroundParseItem*>(job);
    this->RemoveFromUnprocessedItems(backgroundItem);
    --this->pendingBackgroundItems;
    if (!succeeded)
    {
        Assert(FAILED(backgroundItem->GetHR()) || failedBackgroundParseItem);

        if (FAILED(backgroundItem->GetHR()))
        {
            if (!failedBackgroundParseItem)
            {
                failedBackgroundParseItem = backgroundItem;
            }
            else
            {
                // If syntax errors are detected on multiple threads, the lexically earlier one should win.
                CompileScriptException *newPse = backgroundItem->GetPSE();
                CompileScriptException *oldPse = failedBackgroundParseItem->GetPSE();

                if (newPse->line < oldPse->line ||
                    (newPse->line == oldPse->line && newPse->ichMinLine < oldPse->ichMinLine))
                {
                    failedBackgroundParseItem = backgroundItem;
                }
            }
        }
    }
}